

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

bool __thiscall
Graph::containsPathToNode
          (Graph *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *visitedNodes,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *loops)

{
  string *__rhs;
  pointer pCVar1;
  bool bVar2;
  byte in_AL;
  __type _Var3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  pointer pCVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copyVisited;
  Connection connection;
  byte local_d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  Connection local_90;
  
  pCVar5 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __rhs = &local_90.name_to;
  local_d4 = in_AL;
  do {
    if (pCVar5 == pCVar1) {
      local_d4 = 0;
      break;
    }
    Connection::Connection(&local_90,pCVar5);
    _Var3 = std::operator==(&local_90.name_from,
                            (visitedNodes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1);
    bVar2 = true;
    if (_Var3) {
      _Var3 = std::operator==((visitedNodes->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,__rhs);
      if (_Var3) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::push_back(loops,visitedNodes);
        local_d4 = 1;
      }
      else {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((visitedNodes->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (visitedNodes->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,__rhs);
        if (_Var4._M_current ==
            (visitedNodes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_c0,visitedNodes);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c0,
                     __rhs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,&local_c0);
          containsPathToNode(this,&local_a8,loops);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_c0);
          goto LAB_0011debd;
        }
        local_d4 = 0;
      }
      bVar2 = false;
    }
LAB_0011debd:
    Connection::~Connection(&local_90);
    pCVar5 = pCVar5 + 1;
  } while (bVar2);
  return (bool)(local_d4 & 1);
}

Assistant:

bool Graph::containsPathToNode(std::vector<std::string> visitedNodes,
                               std::vector<std::vector<std::string>> &loops) {
    for (auto connection: connections) {
        if (connection.getName_from() == visitedNodes[visitedNodes.size() - 1]) {
            if (visitedNodes[0] == connection.getName_to()) {
                // Found yah
                loops.push_back(visitedNodes);
                return true;
            } else if (std::find(visitedNodes.begin(), visitedNodes.end(), connection.getName_to()) !=
                       visitedNodes.end()) {
                return false; // Just another cycle, not the one we're searching for
            } else {
                std::vector<std::string> copyVisited = visitedNodes;
                copyVisited.emplace_back(connection.getName_to());
                containsPathToNode(copyVisited, loops);
            }
        }
    }
    return false;
}